

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkingDirectory.cxx
# Opt level: O0

void __thiscall cmWorkingDirectory::~cmWorkingDirectory(cmWorkingDirectory *this)

{
  cmWorkingDirectory *this_local;
  
  Pop(this);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmWorkingDirectory::~cmWorkingDirectory()
{
  this->Pop();
}